

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O3

size_t __thiscall Diligent::StandardFile::GetSize(StandardFile *this)

{
  long __off;
  size_t sVar1;
  FILE *__stream;
  string msg;
  string local_38;
  
  __stream = (FILE *)this->m_pFile;
  if (__stream == (FILE *)0x0) {
    FormatString<char[19]>(&local_38,(char (*) [19])"File is not opened");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x59);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    __stream = (FILE *)this->m_pFile;
  }
  __off = ftell(__stream);
  fseek((FILE *)this->m_pFile,0,2);
  sVar1 = ftell((FILE *)this->m_pFile);
  fseek((FILE *)this->m_pFile,__off,0);
  return sVar1;
}

Assistant:

size_t StandardFile::GetSize()
{
    VERIFY(m_pFile, "File is not opened");
    auto OrigPos = ftell(m_pFile);
    fseek(m_pFile, 0, SEEK_END);
    auto FileSize = ftell(m_pFile);

    fseek(m_pFile, OrigPos, SEEK_SET);
    return FileSize;
}